

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesTestsUtil.cpp
# Opt level: O0

VkBufferImageCopy * __thiscall
vkt::sparse::makeBufferImageCopy
          (VkBufferImageCopy *__return_storage_ptr__,sparse *this,VkExtent3D extent,
          deUint32 layerCount,deUint32 mipmapLevel,VkDeviceSize bufferOffset)

{
  undefined4 in_register_0000008c;
  VkImageSubresourceLayers VVar1;
  VkOffset3D VVar2;
  VkBufferImageCopy *copyParams;
  undefined8 local_48;
  deInt32 local_40;
  VkDeviceSize bufferOffset_local;
  deUint32 mipmapLevel_local;
  deUint32 layerCount_local;
  VkExtent3D extent_local;
  
  __return_storage_ptr__->bufferOffset = CONCAT44(in_register_0000008c,mipmapLevel);
  __return_storage_ptr__->bufferRowLength = 0;
  __return_storage_ptr__->bufferImageHeight = 0;
  VVar1 = ::vk::makeImageSubresourceLayers(1,layerCount,0,extent.depth);
  __return_storage_ptr__->imageSubresource = VVar1;
  VVar2 = ::vk::makeOffset3D(0,0,0);
  local_48 = VVar2._0_8_;
  (__return_storage_ptr__->imageOffset).x = (undefined4)local_48;
  (__return_storage_ptr__->imageOffset).y = local_48._4_4_;
  local_40 = VVar2.z;
  (__return_storage_ptr__->imageOffset).z = local_40;
  *(sparse **)&__return_storage_ptr__->imageExtent = this;
  (__return_storage_ptr__->imageExtent).depth = extent.width;
  return __return_storage_ptr__;
}

Assistant:

VkBufferImageCopy makeBufferImageCopy (const VkExtent3D		extent,
									   const deUint32		layerCount,
									   const deUint32		mipmapLevel,
									   const VkDeviceSize	bufferOffset)
{
	const VkBufferImageCopy copyParams =
	{
		bufferOffset,																		//	VkDeviceSize				bufferOffset;
		0u,																					//	deUint32					bufferRowLength;
		0u,																					//	deUint32					bufferImageHeight;
		makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, mipmapLevel, 0u, layerCount),	//	VkImageSubresourceLayers	imageSubresource;
		makeOffset3D(0, 0, 0),																//	VkOffset3D					imageOffset;
		extent,																				//	VkExtent3D					imageExtent;
	};
	return copyParams;
}